

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_memory_model.cpp
# Opt level: O2

void __thiscall spvtools::opt::UpgradeMemoryModel::UpgradeBarriers(UpgradeMemoryModel *this)

{
  Module *pMVar1;
  Instruction *this_00;
  Instruction *this_01;
  UpgradeMemoryModel *this_02;
  pointer ppIVar2;
  bool bVar3;
  uint32_t uVar4;
  DefUseManager *this_03;
  Instruction *pIVar5;
  TypeManager *this_04;
  Type *type;
  uint64_t uVar6;
  ConstantManager *pCVar7;
  Constant *c;
  iterator __begin5;
  pointer ppIVar8;
  Instruction **ppIVar9;
  initializer_list<unsigned_int> init_list;
  uint local_114;
  UpgradeMemoryModel *local_110;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> barriers;
  SmallVector<unsigned_int,_2UL> local_c8;
  _Any_data local_a0;
  code *local_90;
  code *local_88;
  queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> roots;
  
  local_a0._8_8_ = &barriers;
  barriers.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  barriers.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  barriers.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88 = std::
             _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/upgrade_memory_model.cpp:623:37)>
             ::_M_invoke;
  local_90 = std::
             _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/upgrade_memory_model.cpp:623:37)>
             ::_M_manager;
  local_a0._M_unused._M_object = this;
  std::queue<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>>::
  queue<std::deque<unsigned_int,std::allocator<unsigned_int>>,void>(&roots);
  pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar9 = (Instruction **)
            ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  local_110 = this;
  while( true ) {
    this_00 = *ppIVar9;
    if (this_00 ==
        (Instruction *)
        ((long)&(pMVar1->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 8U))
    break;
    uVar4 = Instruction::GetSingleWordInOperand(this_00,0);
    if (uVar4 == 1) {
      uVar4 = Instruction::GetSingleWordInOperand(this_00,1);
      local_c8._vptr_SmallVector = (_func_int **)CONCAT44(local_c8._vptr_SmallVector._4_4_,uVar4);
      std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&roots.c,(uint *)&local_c8);
      bVar3 = IRContext::ProcessCallTreeFromRoots
                        ((local_110->super_Pass).context_,(ProcessFunction *)&local_a0,&roots);
      ppIVar2 = barriers.
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ppIVar8 = barriers.
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (bVar3) {
        for (; ppIVar8 != ppIVar2; ppIVar8 = ppIVar8 + 1) {
          this_01 = *ppIVar8;
          uVar4 = Instruction::GetSingleWordInOperand(this_01,2);
          this_02 = local_110;
          this_03 = IRContext::get_def_use_mgr((local_110->super_Pass).context_);
          pIVar5 = analysis::DefUseManager::GetDef(this_03,uVar4);
          this_04 = IRContext::get_type_mgr((this_02->super_Pass).context_);
          uVar4 = Instruction::type_id(pIVar5);
          type = analysis::TypeManager::GetType(this_04,uVar4);
          uVar6 = GetIndexValue(this_02,pIVar5);
          pCVar7 = IRContext::get_constant_mgr((this_02->super_Pass).context_);
          local_114 = (uint)uVar6 | 0x1000;
          local_c8._vptr_SmallVector = (_func_int **)0x0;
          local_c8.size_ = 0;
          local_c8.buffer[0].data._M_elems = (array<signed_char,_4UL>)0x0;
          local_c8.buffer[1].data._M_elems = (array<signed_char,_4UL>)0x0;
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_range_initialize<unsigned_int_const*>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_c8,&local_114,
                     &local_110);
          c = analysis::ConstantManager::GetConstant
                        (pCVar7,type,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_c8);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_c8);
          pCVar7 = IRContext::get_constant_mgr((this_02->super_Pass).context_);
          pIVar5 = analysis::ConstantManager::GetDefiningInstruction
                             (pCVar7,c,0,(inst_iterator *)0x0);
          local_114 = Instruction::result_id(pIVar5);
          init_list._M_len = 1;
          init_list._M_array = &local_114;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_c8,init_list);
          Instruction::SetInOperand(this_01,2,&local_c8);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_c8);
        }
      }
      if (barriers.
          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          barriers.
          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        barriers.
        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             barriers.
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
    }
    ppIVar9 = &(this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base
            ((_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *)&roots);
  if (local_90 != (code *)0x0) {
    (*local_90)(&local_a0,&local_a0,__destroy_functor);
  }
  std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Vector_base(&barriers.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               );
  return;
}

Assistant:

void UpgradeMemoryModel::UpgradeBarriers() {
  std::vector<Instruction*> barriers;
  // Collects all the control barriers in |function|. Returns true if the
  // function operates on the Output storage class.
  ProcessFunction CollectBarriers = [this, &barriers](Function* function) {
    bool operates_on_output = false;
    for (auto& block : *function) {
      block.ForEachInst([this, &barriers,
                         &operates_on_output](Instruction* inst) {
        if (inst->opcode() == spv::Op::OpControlBarrier) {
          barriers.push_back(inst);
        } else if (!operates_on_output) {
          // This instruction operates on output storage class if it is a
          // pointer to output type or any input operand is a pointer to output
          // type.
          analysis::Type* type =
              context()->get_type_mgr()->GetType(inst->type_id());
          if (type && type->AsPointer() &&
              type->AsPointer()->storage_class() == spv::StorageClass::Output) {
            operates_on_output = true;
            return;
          }
          inst->ForEachInId([this, &operates_on_output](uint32_t* id_ptr) {
            Instruction* op_inst =
                context()->get_def_use_mgr()->GetDef(*id_ptr);
            analysis::Type* op_type =
                context()->get_type_mgr()->GetType(op_inst->type_id());
            if (op_type && op_type->AsPointer() &&
                op_type->AsPointer()->storage_class() ==
                    spv::StorageClass::Output)
              operates_on_output = true;
          });
        }
      });
    }
    return operates_on_output;
  };

  std::queue<uint32_t> roots;
  for (auto& e : get_module()->entry_points())
    if (spv::ExecutionModel(e.GetSingleWordInOperand(0u)) ==
        spv::ExecutionModel::TessellationControl) {
      roots.push(e.GetSingleWordInOperand(1u));
      if (context()->ProcessCallTreeFromRoots(CollectBarriers, &roots)) {
        for (auto barrier : barriers) {
          // Add OutputMemoryKHR to the semantics of the barriers.
          uint32_t semantics_id = barrier->GetSingleWordInOperand(2u);
          Instruction* semantics_inst =
              context()->get_def_use_mgr()->GetDef(semantics_id);
          analysis::Type* semantics_type =
              context()->get_type_mgr()->GetType(semantics_inst->type_id());
          uint64_t semantics_value = GetIndexValue(semantics_inst);
          const analysis::Constant* constant =
              context()->get_constant_mgr()->GetConstant(
                  semantics_type,
                  {static_cast<uint32_t>(semantics_value) |
                   uint32_t(spv::MemorySemanticsMask::OutputMemoryKHR)});
          barrier->SetInOperand(2u, {context()
                                         ->get_constant_mgr()
                                         ->GetDefiningInstruction(constant)
                                         ->result_id()});
        }
      }
      barriers.clear();
    }
}